

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeTupleDrop<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  uint *puVar1;
  bool bVar2;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<unsigned_int> _val;
  Result<unsigned_int> arity;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20);
  tupleArity<wasm::WATParser::ParseDeclsCtx>((Result<unsigned_int> *)__return_storage_ptr___00,ctx);
  Result<unsigned_int>::Result
            ((Result<unsigned_int> *)local_78,(Result<unsigned_int> *)__return_storage_ptr___00);
  local_90 = Result<unsigned_int>::getErr((Result<unsigned_int> *)local_78);
  bVar2 = local_90 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<unsigned_int>::~Result((Result<unsigned_int> *)local_78);
  if (bVar2) {
    puVar1 = Result<unsigned_int>::operator*
                       ((Result<unsigned_int> *)
                        ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    NullInstrParserCtx::makeTupleDrop
              (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,*puVar1);
  }
  Result<unsigned_int>::~Result
            ((Result<unsigned_int> *)
             ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeTupleDrop(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto arity = tupleArity(ctx);
  CHECK_ERR(arity);
  return ctx.makeTupleDrop(pos, annotations, *arity);
}